

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M68KDisassembler.c
# Opt level: O0

void d68040_move16_pi_pi(m68k_info *info)

{
  long in_RDI;
  int modes [2];
  int data [2];
  undefined4 in_stack_fffffffffffffff4;
  
  read_imm_16((m68k_info *)
              (CONCAT44(in_stack_fffffffffffffff4,*(undefined4 *)(in_RDI + 0x24)) &
              0xffffffff00000007));
  if ((*(uint *)(in_RDI + 0x28) & 0x10) == 0) {
    d68000_invalid((m68k_info *)0x3a95d1);
  }
  else {
    build_move16(info,(int *)data,(int *)modes);
  }
  return;
}

Assistant:

static void d68040_move16_pi_pi(m68k_info *info)
{
	int data[] = { info->ir & 7, (read_imm_16(info) >> 12) & 7 };
	int modes[] = { M68K_AM_REGI_ADDR_POST_INC, M68K_AM_REGI_ADDR_POST_INC };

	LIMIT_CPU_TYPES(info, M68040_PLUS);

	build_move16(info, data, modes);
}